

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.h
# Opt level: O3

void __thiscall TreeNode::~TreeNode(TreeNode *this)

{
  ~TreeNode(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~TreeNode() { removeElements(); }